

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O0

void ht_task_scheduler_tick(HT_TaskScheduler *task_scheduler)

{
  undefined8 *ptr;
  int iVar1;
  HT_TimestampNs HVar2;
  long local_38;
  HT_TimestampNs now_ts;
  HT_Task *task;
  ulong uStack_18;
  HT_Boolean result;
  size_t i;
  HT_TaskScheduler *task_scheduler_local;
  
  for (uStack_18 = 0; uStack_18 < (task_scheduler->tasks).size; uStack_18 = uStack_18 + 1) {
    ptr = (undefined8 *)(task_scheduler->tasks).data[uStack_18];
    HVar2 = ht_monotonic_clock_get_timestamp();
    if ((ulong)ptr[3] <= HVar2) {
      iVar1 = (*(code *)*ptr)(ptr[1]);
      if (iVar1 == 0) {
        ht_bag_void_ptr_remove_nth(&task_scheduler->tasks,uStack_18);
        ht_free(ptr);
        uStack_18 = uStack_18 - 1;
      }
      else {
        if (*(int *)((long)ptr + 0x24) == 0) {
          local_38 = ptr[3] + ptr[2];
        }
        else {
          HVar2 = ht_monotonic_clock_get_timestamp();
          local_38 = HVar2 + ptr[2];
        }
        ptr[3] = local_38;
      }
    }
  }
  return;
}

Assistant:

void
ht_task_scheduler_tick(HT_TaskScheduler* task_scheduler)
{
    size_t i;
    HT_Boolean result;

    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        HT_Task* task = HT_TASK(task_scheduler->tasks.data[i]);
        HT_TimestampNs now_ts = ht_monotonic_clock_get_timestamp();
        if (task->next_action_ts > now_ts)
        {
            continue;
        }

        result = task->callback(task->user_data);

        if (result == HT_FALSE)
        {
            ht_bag_void_ptr_remove_nth(&task_scheduler->tasks, i);
            ht_free(task);
            i--;
        }
        else
        {
            task->next_action_ts = task->mode == HT_TASK_SCHEDULING_IGNORE_DELAYS ?
                        task->next_action_ts + task->period :
                        ht_monotonic_clock_get_timestamp() + task->period;
        }
    }
}